

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void sqlite3FkDropTable(Parse *pParse,SrcList *pName,Table *pTab)

{
  sqlite3 *db;
  Vdbe *p;
  HashElem *pHVar1;
  FKey *pFVar2;
  SrcList *pTabList;
  ExprList *in_RCX;
  Expr *in_R8;
  uint p2;
  
  db = pParse->db;
  if (((db->flags & 0x4000) != 0) && (pTab->eTabType == '\0')) {
    p = sqlite3GetVdbe(pParse);
    p2 = 0;
    pHVar1 = findElementWithHash(&pTab->pSchema->fkeyHash,pTab->zName,(uint *)0x0);
    if (pHVar1->data == (void *)0x0) {
      for (pFVar2 = (pTab->u).tab.pFKey; pFVar2 != (FKey *)0x0; pFVar2 = pFVar2->pNextFrom) {
        if ((pFVar2->isDeferred != '\0') || ((db->flags & 0x80000) != 0)) {
          p2 = pParse->nLabel - 1;
          pParse->nLabel = p2;
          in_RCX = (ExprList *)(ulong)p2;
          in_R8 = (Expr *)0x0;
          sqlite3VdbeAddOp3(p,0x31,1,p2,0);
          goto LAB_001882aa;
        }
      }
    }
    else {
LAB_001882aa:
      pParse->disableTriggers = '\x01';
      pTabList = sqlite3SrcListDup(db,pName,0);
      sqlite3DeleteFrom(pParse,pTabList,(Expr *)0x0,in_RCX,in_R8);
      pParse->disableTriggers = '\0';
      if ((db->flags & 0x80000) == 0) {
        sqlite3VdbeAddOp3(p,0x31,0,p->nOp + 2,0);
        sqlite3HaltConstraint(pParse,0x313,2,(char *)0x0,-1,'\x04');
      }
      if (p2 != 0) {
        sqlite3VdbeResolveLabel(p,p2);
        return;
      }
    }
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3FkDropTable(Parse *pParse, SrcList *pName, Table *pTab){
  sqlite3 *db = pParse->db;
  if( (db->flags&SQLITE_ForeignKeys) && IsOrdinaryTable(pTab) ){
    int iSkip = 0;
    Vdbe *v = sqlite3GetVdbe(pParse);

    assert( v );                  /* VDBE has already been allocated */
    assert( IsOrdinaryTable(pTab) );
    if( sqlite3FkReferences(pTab)==0 ){
      /* Search for a deferred foreign key constraint for which this table
      ** is the child table. If one cannot be found, return without
      ** generating any VDBE code. If one can be found, then jump over
      ** the entire DELETE if there are no outstanding deferred constraints
      ** when this statement is run.  */
      FKey *p;
      for(p=pTab->u.tab.pFKey; p; p=p->pNextFrom){
        if( p->isDeferred || (db->flags & SQLITE_DeferFKs) ) break;
      }
      if( !p ) return;
      iSkip = sqlite3VdbeMakeLabel(pParse);
      sqlite3VdbeAddOp2(v, OP_FkIfZero, 1, iSkip); VdbeCoverage(v);
    }

    pParse->disableTriggers = 1;
    sqlite3DeleteFrom(pParse, sqlite3SrcListDup(db, pName, 0), 0, 0, 0);
    pParse->disableTriggers = 0;

    /* If the DELETE has generated immediate foreign key constraint
    ** violations, halt the VDBE and return an error at this point, before
    ** any modifications to the schema are made. This is because statement
    ** transactions are not able to rollback schema changes.
    **
    ** If the SQLITE_DeferFKs flag is set, then this is not required, as
    ** the statement transaction will not be rolled back even if FK
    ** constraints are violated.
    */
    if( (db->flags & SQLITE_DeferFKs)==0 ){
      sqlite3VdbeVerifyAbortable(v, OE_Abort);
      sqlite3VdbeAddOp2(v, OP_FkIfZero, 0, sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
      sqlite3HaltConstraint(pParse, SQLITE_CONSTRAINT_FOREIGNKEY,
          OE_Abort, 0, P4_STATIC, P5_ConstraintFK);
    }

    if( iSkip ){
      sqlite3VdbeResolveLabel(v, iSkip);
    }
  }
}